

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O1

SparseMatrix *
ipx::CopyColumns(SparseMatrix *__return_storage_ptr__,SparseMatrix *A,
                vector<int,_std::allocator<int>_> *cols)

{
  int iVar1;
  int *piVar2;
  pointer piVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  
  SparseMatrix::SparseMatrix(__return_storage_ptr__,A->nrow_,0);
  piVar2 = (cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar5 = (cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar5 != piVar2; piVar5 = piVar5 + 1) {
    lVar6 = (long)*piVar5;
    piVar3 = (A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar3[lVar6];
    lVar4 = (long)iVar1;
    if (iVar1 < piVar3[lVar6 + 1]) {
      do {
        SparseMatrix::push_back
                  (__return_storage_ptr__,
                   (A->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4],
                   (A->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 < (A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar6 + 1]);
    }
    SparseMatrix::add_column(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

SparseMatrix CopyColumns(const SparseMatrix& A, const std::vector<Int>& cols) {
    SparseMatrix A2(A.rows(), 0);
    for (Int j : cols) {
        for (Int p = A.begin(j); p < A.end(j); p++)
            A2.push_back(A.index(p), A.value(p));
        A2.add_column();
    }
    return A2;
}